

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

void __thiscall
Tree::BuildUnitImpl(Tree *this,cmXMLWriter *xml,string *virtualFolderPath,string *fsPath)

{
  Tree *pTVar1;
  _Base_ptr p_Var2;
  Tree *this_00;
  cmAlphaNum local_130;
  cmAlphaNum local_100;
  cmAlphaNum local_d0;
  cmAlphaNum local_a0;
  string local_70;
  string local_50;
  
  for (p_Var2 = (this->files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->files)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"Unit",(allocator<char> *)&local_100);
    cmXMLWriter::StartElement(xml,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    local_130.View_._M_str = (fsPath->_M_dataplus)._M_p;
    local_130.View_._M_len = fsPath->_M_string_length;
    local_100.View_._M_str = (this->path)._M_dataplus._M_p;
    local_100.View_._M_len = (this->path)._M_string_length;
    cmStrCat<char[2],std::__cxx11::string>
              ((string *)&local_d0,&local_130,&local_100,(char (*) [2])0x6b4baa,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var2 + 1));
    cmXMLWriter::Attribute<std::__cxx11::string>
              (xml,"filename",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"Option",(allocator<char> *)&local_100);
    cmXMLWriter::StartElement(xml,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    local_130.View_._M_len = 0xc;
    local_130.View_._M_str = "CMake Files\\";
    local_100.View_._M_str = (virtualFolderPath->_M_dataplus)._M_p;
    local_100.View_._M_len = virtualFolderPath->_M_string_length;
    cmStrCat<std::__cxx11::string,char[2]>
              ((string *)&local_d0,&local_130,&local_100,&this->path,(char (*) [2])0x66cdc6);
    cmXMLWriter::Attribute<std::__cxx11::string>
              (xml,"virtualFolder",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    cmXMLWriter::EndElement(xml);
    cmXMLWriter::EndElement(xml);
  }
  pTVar1 = (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pTVar1; this_00 = this_00 + 1) {
    local_130.View_._M_str = (virtualFolderPath->_M_dataplus)._M_p;
    local_130.View_._M_len = virtualFolderPath->_M_string_length;
    local_100.View_._M_str = (this->path)._M_dataplus._M_p;
    local_100.View_._M_len = (this->path)._M_string_length;
    cmStrCat<char[2]>(&local_50,&local_130,&local_100,(char (*) [2])0x66cdc6);
    local_d0.View_._M_str = (fsPath->_M_dataplus)._M_p;
    local_d0.View_._M_len = fsPath->_M_string_length;
    local_a0.View_._M_str = (this->path)._M_dataplus._M_p;
    local_a0.View_._M_len = (this->path)._M_string_length;
    cmStrCat<char[2]>(&local_70,&local_d0,&local_a0,(char (*) [2])0x6b4baa);
    BuildUnitImpl(this_00,xml,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void Tree::BuildUnitImpl(cmXMLWriter& xml,
                         const std::string& virtualFolderPath,
                         const std::string& fsPath) const
{
  for (std::string const& f : this->files) {
    xml.StartElement("Unit");
    xml.Attribute("filename", cmStrCat(fsPath, this->path, "/", f));

    xml.StartElement("Option");
    xml.Attribute(
      "virtualFolder",
      cmStrCat("CMake Files\\", virtualFolderPath, this->path, "\\"));
    xml.EndElement();

    xml.EndElement();
  }
  for (Tree const& folder : this->folders) {
    folder.BuildUnitImpl(xml, cmStrCat(virtualFolderPath, this->path, "\\"),
                         cmStrCat(fsPath, this->path, "/"));
  }
}